

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_sizeof_matchState(ZSTD_compressionParameters *cParams,U32 forCCtx)

{
  long lVar1;
  bool bVar2;
  byte local_58;
  byte local_54;
  long local_50;
  size_t optSpace;
  size_t optPotentialSpace;
  size_t tableSpace;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  U32 forCCtx_local;
  ZSTD_compressionParameters *cParams_local;
  
  if (cParams->strategy == ZSTD_fast) {
    local_50 = 0;
  }
  else {
    local_50 = 1L << ((byte)cParams->chainLog & 0x3f);
  }
  if ((forCCtx == 0) || (cParams->searchLength != 3)) {
    local_58 = 0;
  }
  else {
    if (cParams->windowLog < 0x12) {
      local_54 = (byte)cParams->windowLog;
    }
    else {
      local_54 = 0x11;
    }
    local_58 = local_54;
  }
  bVar2 = false;
  if ((forCCtx != 0) && (bVar2 = true, cParams->strategy != ZSTD_btopt)) {
    bVar2 = cParams->strategy == ZSTD_btultra;
  }
  lVar1 = 0;
  if (bVar2) {
    lVar1 = 0x24608;
  }
  return (local_50 + (1L << ((byte)cParams->hashLog & 0x3f)) + (1L << (local_58 & 0x3f))) * 4 +
         lVar1;
}

Assistant:

static size_t ZSTD_sizeof_matchState(ZSTD_compressionParameters const* cParams, const U32 forCCtx)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->searchLength==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = ((size_t)1) << hashLog3;
    size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);
    size_t const optPotentialSpace = ((MaxML+1) + (MaxLL+1) + (MaxOff+1) + (1<<Litbits)) * sizeof(U32)
                          + (ZSTD_OPT_NUM+1) * (sizeof(ZSTD_match_t)+sizeof(ZSTD_optimal_t));
    size_t const optSpace = (forCCtx && ((cParams->strategy == ZSTD_btopt) ||
                                         (cParams->strategy == ZSTD_btultra)))
                                ? optPotentialSpace
                                : 0;
    DEBUGLOG(4, "chainSize: %u - hSize: %u - h3Size: %u",
                (U32)chainSize, (U32)hSize, (U32)h3Size);
    return tableSpace + optSpace;
}